

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionShape.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChBeamSectionShapePolyline::UpdateProfile(ChBeamSectionShapePolyline *this)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  std::
  vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
  ::resize((vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
            *)(this + 0x20),
           (*(long *)(this + 0x10) - *(long *)(this + 8) >> 3) * -0x5555555555555555);
  lVar7 = *(long *)(this + 8);
  if (*(long *)(this + 0x10) != lVar7) {
    uVar10 = 0;
    do {
      lVar6 = uVar10 * 0x18;
      std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
                ((vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)
                 (*(long *)(this + 0x20) + lVar6),
                 (*(long *)(lVar7 + 8 + lVar6) - *(long *)(lVar7 + lVar6) >> 3) *
                 -0x5555555555555555);
      lVar7 = *(long *)(*(long *)(this + 8) + lVar6);
      if ((*(long *)(*(long *)(this + 8) + 8 + lVar6) - lVar7 >> 3) * -0x5555555555555555 - 3U <
          0xfffffffffffffffe) {
        uVar9 = 1;
        lVar8 = 0;
        do {
          dVar1 = *(double *)(lVar7 + 0x38 + lVar8) - *(double *)(lVar7 + 8 + lVar8);
          dVar2 = *(double *)(lVar7 + 0x40 + lVar8) - *(double *)(lVar7 + 0x10 + lVar8);
          auVar11._8_8_ = 0;
          auVar11._0_8_ = dVar2 * dVar2;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = dVar1;
          auVar11 = vfmadd231sd_fma(auVar11,auVar18,auVar18);
          if (auVar11._0_8_ < 0.0) {
            dVar12 = sqrt(auVar11._0_8_);
          }
          else {
            auVar11 = vsqrtsd_avx(auVar11,auVar11);
            dVar12 = auVar11._0_8_;
          }
          auVar15._8_8_ = 0;
          auVar15._0_8_ = dVar2;
          uVar9 = uVar9 + 1;
          auVar3._8_8_ = 0x8000000000000000;
          auVar3._0_8_ = 0x8000000000000000;
          auVar11 = vxorpd_avx512vl(auVar15,auVar3);
          lVar7 = *(long *)(*(long *)(this + 0x20) + lVar6);
          *(double *)(lVar7 + 0x20 + lVar8) = auVar11._0_8_ / dVar12;
          *(double *)(lVar7 + 0x28 + lVar8) = dVar1 / dVar12;
          lVar7 = *(long *)(*(long *)(this + 8) + lVar6);
          lVar8 = lVar8 + 0x18;
        } while (uVar9 < (*(long *)(*(long *)(this + 8) + 8 + lVar6) - lVar7 >> 3) *
                         -0x5555555555555555 - 1U);
      }
      dVar1 = *(double *)(lVar7 + 0x20) - *(double *)(lVar7 + 8);
      dVar2 = *(double *)(lVar7 + 0x28) - *(double *)(lVar7 + 0x10);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = dVar2 * dVar2;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar1;
      auVar11 = vfmadd231sd_fma(auVar13,auVar19,auVar19);
      if (auVar11._0_8_ < 0.0) {
        dVar12 = sqrt(auVar11._0_8_);
      }
      else {
        auVar11 = vsqrtsd_avx(auVar11,auVar11);
        dVar12 = auVar11._0_8_;
      }
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dVar2;
      auVar4._8_8_ = 0x8000000000000000;
      auVar4._0_8_ = 0x8000000000000000;
      auVar11 = vxorpd_avx512vl(auVar16,auVar4);
      lVar7 = *(long *)(*(long *)(this + 0x20) + lVar6);
      *(double *)(lVar7 + 8) = auVar11._0_8_ / dVar12;
      *(double *)(lVar7 + 0x10) = dVar1 / dVar12;
      lVar7 = *(long *)(*(long *)(this + 8) + 8 + lVar6);
      dVar1 = *(double *)(lVar7 + -0x10) - *(double *)(lVar7 + -0x28);
      dVar2 = *(double *)(lVar7 + -8) - *(double *)(lVar7 + -0x20);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar2 * dVar2;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar1;
      auVar11 = vfmadd231sd_fma(auVar14,auVar20,auVar20);
      if (auVar11._0_8_ < 0.0) {
        dVar12 = sqrt(auVar11._0_8_);
      }
      else {
        auVar11 = vsqrtsd_avx(auVar11,auVar11);
        dVar12 = auVar11._0_8_;
      }
      auVar17._8_8_ = 0;
      auVar17._0_8_ = dVar2;
      auVar5._8_8_ = 0x8000000000000000;
      auVar5._0_8_ = 0x8000000000000000;
      auVar11 = vxorpd_avx512vl(auVar17,auVar5);
      lVar8 = *(long *)(*(long *)(this + 8) + 8 + lVar6) - *(long *)(*(long *)(this + 8) + lVar6);
      lVar7 = *(long *)(*(long *)(this + 0x20) + lVar6);
      *(double *)(lVar7 + -0x10 + lVar8) = auVar11._0_8_ / dVar12;
      *(double *)(lVar7 + -8 + lVar8) = dVar1 / dVar12;
      uVar10 = uVar10 + 1;
      lVar7 = *(long *)(this + 8);
      uVar9 = (*(long *)(this + 0x10) - lVar7 >> 3) * -0x5555555555555555;
    } while (uVar10 <= uVar9 && uVar9 - uVar10 != 0);
  }
  return;
}

Assistant:

void ChBeamSectionShapePolyline::UpdateProfile() {
    ml_normals.resize(ml_points.size());

    for (int il = 0; il < ml_points.size(); ++il) {
        ml_normals[il].resize(ml_points[il].size());
        double dy, dz, len;
        for (int ip = 1; ip < ml_points[il].size() - 1; ++ip) {
            dy = ml_points[il][ip + 1].y() - ml_points[il][ip - 1].y();
            dz = ml_points[il][ip + 1].z() - ml_points[il][ip - 1].z();
            len = sqrt(dy * dy + dz * dz);
            ml_normals[il][ip].y() = -dz / len;
            ml_normals[il][ip].z() = dy / len;
        }
        dy = ml_points[il][1].y() - ml_points[il][0].y();
        dz = ml_points[il][1].z() - ml_points[il][0].z();
        len = sqrt(dy * dy + dz * dz);
        ml_normals[il][0].y() = -dz / len;
        ml_normals[il][0].z() = dy / len;
        dy = ml_points[il][ml_points[il].size() - 1].y() - ml_points[il][ml_points[il].size() - 2].y();
        dz = ml_points[il][ml_points[il].size() - 1].z() - ml_points[il][ml_points[il].size() - 2].z();
        len = sqrt(dy * dy + dz * dz);
        ml_normals[il][ml_points[il].size() - 1].y() = -dz / len;
        ml_normals[il][ml_points[il].size() - 1].z() = dy / len;
    }
}